

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O0

int XMLNode_get_attribute_with_default
              (XMLNode *node,SXML_CHAR *attr_name,SXML_CHAR **attr_value,
              SXML_CHAR *default_attr_value)

{
  int iVar1;
  char *pcVar2;
  int i;
  XMLAttribute *pt;
  SXML_CHAR *default_attr_value_local;
  SXML_CHAR **attr_value_local;
  SXML_CHAR *attr_name_local;
  XMLNode *node_local;
  
  if ((((node == (XMLNode *)0x0) || (attr_name == (SXML_CHAR *)0x0)) || (*attr_name == '\0')) ||
     ((attr_value == (SXML_CHAR **)0x0 || (node->init_value != 0x19770522)))) {
    node_local._4_4_ = 0;
  }
  else {
    iVar1 = XMLNode_search_attribute(node,attr_name,0);
    if (iVar1 < 0) {
      if (default_attr_value == (SXML_CHAR *)0x0) {
        *attr_value = (SXML_CHAR *)0x0;
      }
      else {
        pcVar2 = strdup(default_attr_value);
        *attr_value = pcVar2;
        if (*attr_value == (SXML_CHAR *)0x0) {
          return 0;
        }
      }
    }
    else if (node->attributes[iVar1].value == (SXML_CHAR *)0x0) {
      *attr_value = (SXML_CHAR *)0x0;
    }
    else {
      pcVar2 = strdup(node->attributes[iVar1].value);
      *attr_value = pcVar2;
      if (*attr_value == (SXML_CHAR *)0x0) {
        return 0;
      }
    }
    node_local._4_4_ = 1;
  }
  return node_local._4_4_;
}

Assistant:

int XMLNode_get_attribute_with_default(XMLNode* node, const SXML_CHAR* attr_name, const SXML_CHAR** attr_value, const SXML_CHAR* default_attr_value)
{
	XMLAttribute* pt;
	int i;
	
	if (node == NULL || attr_name == NULL || attr_name[0] == NULC || attr_value == NULL || node->init_value != XML_INIT_DONE)
		return FALSE;
	
	i = XMLNode_search_attribute(node, attr_name, 0);
	if (i >= 0) {
		pt = node->attributes;
		if (pt[i].value != NULL) {
			*attr_value = sx_strdup(pt[i].value);
			if (*attr_value == NULL)
				return FALSE;
		} else
			*attr_value = NULL; /* NULL but returns 'true' as 'NULL' is the actual attribute value */
	} else if (default_attr_value != NULL) {
		*attr_value = sx_strdup(default_attr_value);
		if (*attr_value == NULL)
			return FALSE;
	} else
		*attr_value = NULL;

	return TRUE;
}